

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildBrReg2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,uint targetOffset,RegSlot R1,RegSlot R2)

{
  OpCode OVar1;
  uint targetOffset_00;
  RegOpnd *src1Opnd_00;
  RegOpnd *src2Opnd_00;
  BranchInstr *branchInstr_00;
  OpCode peekOpcode;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  BranchInstr *branchInstr;
  RegSlot R2_local;
  RegSlot R1_local;
  uint targetOffset_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  if (newOpcode == BrOnEmpty) {
    BuildBrBReturn(this,BrOnEmpty,offset,R1,R2,targetOffset);
  }
  else {
    src1Opnd_00 = BuildSrcOpnd(this,R1,TyVar);
    src2Opnd_00 = BuildSrcOpnd(this,R2,TyVar);
    if (newOpcode == Case) {
      SwitchIRBuilder::OnCase
                (&this->m_switchBuilder,src1Opnd_00,&src2Opnd_00->super_Opnd,offset,targetOffset);
      EnsureConsumeBranchIsland(this);
      OVar1 = Js::ByteCodeReader::PeekOp(&this->m_jnReader);
      if ((OVar1 != Case) && (OVar1 != EndSwitch)) {
        targetOffset_00 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
        SwitchIRBuilder::FlushCases(&this->m_switchBuilder,targetOffset_00);
      }
    }
    else {
      branchInstr_00 =
           IR::BranchInstr::New
                     (newOpcode,(LabelInstr *)0x0,&src1Opnd_00->super_Opnd,&src2Opnd_00->super_Opnd,
                      this->m_func);
      AddBranchInstr(this,branchInstr_00,offset,targetOffset);
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildBrReg2(Js::OpCode newOpcode, uint32 offset, uint targetOffset, Js::RegSlot R1, Js::RegSlot R2)
{
    IR::BranchInstr * branchInstr;

    if (newOpcode == Js::OpCode::BrOnEmpty
        /* || newOpcode == Js::OpCode::BrOnNotEmpty */     // BrOnNotEmpty not generate by the byte code
            )
    {
        BuildBrBReturn(newOpcode, offset, R1, R2, targetOffset);
        return;
    }

    IR::RegOpnd *     src1Opnd;
    IR::RegOpnd *     src2Opnd;

    src1Opnd = this->BuildSrcOpnd(R1);
    src2Opnd = this->BuildSrcOpnd(R2);

    if (newOpcode == Js::OpCode::Case)
    {
        // generating branches for Cases is entirely handled
        // by the SwitchIRBuilder

        m_switchBuilder.OnCase(src1Opnd, src2Opnd, offset, targetOffset);

#ifdef BYTECODE_BRANCH_ISLAND
        // Make sure that if there are branch island between the cases, we consume it first
        EnsureConsumeBranchIsland();
#endif

        // some instructions can't be optimized past, such as LdFld for objects. In these cases we have
        // to inform the SwitchBuilder to flush any optimized cases that it has stored up to this point
        // peeks the next opcode - to check if it is not a case statement (for example: the next instr can be a LdFld for objects)
        Js::OpCode peekOpcode = m_jnReader.PeekOp();
        if (peekOpcode != Js::OpCode::Case && peekOpcode != Js::OpCode::EndSwitch)
        {
            m_switchBuilder.FlushCases(m_jnReader.GetCurrentOffset());
        }
    }
    else
    {
        branchInstr = IR::BranchInstr::New(newOpcode, nullptr, src1Opnd, src2Opnd, m_func);
        this->AddBranchInstr(branchInstr, offset, targetOffset);
    }
}